

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int io_file_readline(lua_State *L,FILE *fp,MSize chop)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  GCstr *pGVar4;
  FILE *in_RSI;
  long in_RDI;
  char *buf;
  MSize ok;
  MSize n;
  MSize m;
  undefined8 in_stack_ffffffffffffff60;
  lua_State *in_stack_ffffffffffffff68;
  lua_State *L_00;
  uint local_88;
  uint local_84;
  int local_80;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  local_80 = 0x2000;
  local_84 = 0;
  local_88 = 0;
  while( true ) {
    pcVar1 = lj_buf_tmp(in_stack_ffffffffffffff68,(MSize)((ulong)in_stack_ffffffffffffff60 >> 0x20))
    ;
    pcVar2 = fgets(pcVar1 + local_84,local_80 - local_84,in_RSI);
    if (pcVar2 == (char *)0x0) break;
    sVar3 = strlen(pcVar1 + local_84);
    local_84 = (int)sVar3 + local_84;
    local_88 = local_84 | local_88;
    if ((local_84 != 0) && (pcVar1[local_84 - 1] == '\n')) break;
    if (local_80 - 0x40U <= local_84) {
      local_80 = local_80 * 2;
    }
  }
  L_00 = *(lua_State **)(in_RDI + 0x18);
  *(MRef **)(in_RDI + 0x18) = &L_00->glref;
  pGVar4 = lj_str_new((lua_State *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  (L_00->nextgc).gcptr32 = (uint32_t)pGVar4;
  L_00->marked = 0xfb;
  L_00->gct = 0xff;
  L_00->dummy_ffid = 0xff;
  L_00->status = 0xff;
  if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x54) <=
      *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x50)) {
    lj_gc_step(L_00);
  }
  return local_88;
}

Assistant:

static int io_file_readline(lua_State *L, FILE *fp, MSize chop)
{
  MSize m = LUAL_BUFFERSIZE, n = 0, ok = 0;
  char *buf;
  for (;;) {
    buf = lj_buf_tmp(L, m);
    if (fgets(buf+n, m-n, fp) == NULL) break;
    n += (MSize)strlen(buf+n);
    ok |= n;
    if (n && buf[n-1] == '\n') { n -= chop; break; }
    if (n >= m - 64) m += m;
  }
  setstrV(L, L->top++, lj_str_new(L, buf, (size_t)n));
  lj_gc_check(L);
  return (int)ok;
}